

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

int bench_ecmult_multi_callback(secp256k1_scalar *sc,secp256k1_ge *ge,size_t idx,void *arg)

{
  long in_RCX;
  undefined8 *puVar1;
  long in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  bench_data *data;
  long local_18;
  
  local_18 = in_RDX;
  if (*(int *)(in_RCX + 0x48) != 0) {
    local_18 = in_RDX + 1;
  }
  if (local_18 == 0) {
    puVar1 = (undefined8 *)(*(long *)(in_RCX + 0x10) + *(long *)(in_RCX + 0x50) * 0x20);
    *in_RDI = *puVar1;
    in_RDI[1] = puVar1[1];
    in_RDI[2] = puVar1[2];
    in_RDI[3] = puVar1[3];
    memcpy(in_RSI,&secp256k1_ge_const_g,0x58);
  }
  else {
    puVar1 = (undefined8 *)
             (*(long *)(in_RCX + 0x10) + (*(long *)(in_RCX + 0x50) + local_18 & 0x7fffU) * 0x20);
    *in_RDI = *puVar1;
    in_RDI[1] = puVar1[1];
    in_RDI[2] = puVar1[2];
    in_RDI[3] = puVar1[3];
    memcpy(in_RSI,(void *)(*(long *)(in_RCX + 0x18) +
                          ((*(long *)(in_RCX + 0x58) + local_18) - 1U & 0x7fff) * 0x58),0x58);
  }
  return 1;
}

Assistant:

static int bench_ecmult_multi_callback(secp256k1_scalar* sc, secp256k1_ge* ge, size_t idx, void* arg) {
    bench_data* data = (bench_data*)arg;
    if (data->includes_g) ++idx;
    if (idx == 0) {
        *sc = data->scalars[data->offset1];
        *ge = secp256k1_ge_const_g;
    } else {
        *sc = data->scalars[(data->offset1 + idx) % POINTS];
        *ge = data->pubkeys[(data->offset2 + idx - 1) % POINTS];
    }
    return 1;
}